

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_echo(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  char *in_RSI;
  char buffer [9216];
  DESCRIPTOR_DATA *d;
  CHAR_DATA *in_stack_ffffffffffffdbd8;
  CHAR_DATA *in_stack_ffffffffffffdbe8;
  CHAR_DATA *in_stack_ffffffffffffdbf0;
  char *in_stack_ffffffffffffdbf8;
  char *in_stack_ffffffffffffdc00;
  DESCRIPTOR_DATA *local_18;
  
  if (*in_RSI == '\0') {
    send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
  }
  else {
    for (local_18 = descriptor_list; local_18 != (DESCRIPTOR_DATA *)0x0; local_18 = local_18->next)
    {
      if (local_18->connected == 0) {
        colorconv(in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
        iVar1 = get_trust(in_stack_ffffffffffffdbd8);
        iVar2 = get_trust(in_stack_ffffffffffffdbd8);
        if (iVar2 <= iVar1) {
          send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
          send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
        }
        send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
        send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
      }
    }
  }
  return;
}

Assistant:

void do_echo(CHAR_DATA *ch, char *argument)
{
	DESCRIPTOR_DATA *d;
	char buffer[MAX_STRING_LENGTH * 2];

	if (argument[0] == '\0')
	{
		send_to_char("Global echo what?\n\r", ch);
		return;
	}

	for (d = descriptor_list; d; d = d->next)
	{
		if (d->connected == CON_PLAYING)
		{
			colorconv(buffer, argument, d->character);

			if (get_trust(d->character) >= get_trust(ch))
			{
				send_to_char(ch->name, d->character);
				send_to_char(" globals: ", d->character);
			}

			send_to_char(buffer, d->character);
			send_to_char("\n\r", d->character);
		}
	}
}